

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c++
# Opt level: O3

Duration __thiscall kj::Thread::getCpuTime(Thread *this)

{
  int iVar1;
  clockid_t clockId;
  timespec ts;
  Fault f_1;
  clockid_t local_34;
  timespec local_30;
  Fault local_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  iVar1 = pthread_getcpuclockid(this->threadId,&local_34);
  if (iVar1 != 0) {
    local_30.tv_sec = 0;
    local_18 = 0;
    uStack_10 = 0;
    kj::_::Debug::Fault::init
              ((Fault *)&local_30,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/thread.c++"
              );
    kj::_::Debug::Fault::fatal((Fault *)&local_30);
  }
  do {
    iVar1 = clock_gettime(local_34,&local_30);
    if (-1 < iVar1) goto LAB_00451b60;
    iVar1 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    local_20.exception = (Exception *)0x0;
    local_18 = 0;
    uStack_10 = 0;
    kj::_::Debug::Fault::init
              (&local_20,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/thread.c++"
              );
    kj::_::Debug::Fault::fatal(&local_20);
  }
LAB_00451b60:
  return (Duration)(local_30.tv_sec * 1000000000 + local_30.tv_nsec);
}

Assistant:

kj::Duration Thread::getCpuTime() const {
  clockid_t clockId;
  int pthreadResult = pthread_getcpuclockid(
      *reinterpret_cast<const pthread_t*>(&threadId), &clockId);
  if (pthreadResult != 0) {
    KJ_FAIL_SYSCALL("pthread_getcpuclockid", pthreadResult);
  }

  struct timespec ts;
  KJ_SYSCALL(clock_gettime(clockId, &ts));

  return ts.tv_sec * kj::SECONDS + ts.tv_nsec * kj::NANOSECONDS;
}